

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.hpp
# Opt level: O1

void __thiscall
duckdb::BatchCollectionChunkScanState::BatchCollectionChunkScanState
          (BatchCollectionChunkScanState *this,BatchCollectionChunkScanState *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  pointer puVar7;
  
  (this->super_ChunkScanState)._vptr_ChunkScanState = (_func_int **)&PTR__ChunkScanState_019a6f10;
  (this->super_ChunkScanState).offset = (other->super_ChunkScanState).offset;
  (this->super_ChunkScanState).finished = (other->super_ChunkScanState).finished;
  (this->super_ChunkScanState).current_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
       (other->super_ChunkScanState).current_chunk.
       super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
       super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
       super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
  (other->super_ChunkScanState).current_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_ChunkScanState)._vptr_ChunkScanState =
       (_func_int **)&PTR__BatchCollectionChunkScanState_019d08a8;
  this->collection = other->collection;
  uVar1 = *(undefined4 *)((long)&(other->state).range.begin._M_node + 4);
  uVar2 = *(undefined4 *)&(other->state).range.end._M_node;
  uVar3 = *(undefined4 *)((long)&(other->state).range.end._M_node + 4);
  *(undefined4 *)&(this->state).range.begin._M_node =
       *(undefined4 *)&(other->state).range.begin._M_node;
  *(undefined4 *)((long)&(this->state).range.begin._M_node + 4) = uVar1;
  *(undefined4 *)&(this->state).range.end._M_node = uVar2;
  *(undefined4 *)((long)&(this->state).range.end._M_node + 4) = uVar3;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&(this->state).scan_state,&(other->state).scan_state);
  (this->state).scan_state.current_chunk_state.properties =
       (other->state).scan_state.current_chunk_state.properties;
  iVar4 = (other->state).scan_state.chunk_index;
  iVar5 = (other->state).scan_state.current_row_index;
  iVar6 = (other->state).scan_state.next_row_index;
  (this->state).scan_state.segment_index = (other->state).scan_state.segment_index;
  (this->state).scan_state.chunk_index = iVar4;
  (this->state).scan_state.current_row_index = iVar5;
  (this->state).scan_state.next_row_index = iVar6;
  (this->state).scan_state.properties = (other->state).scan_state.properties;
  puVar7 = *(pointer *)
            ((long)&(other->state).scan_state.column_ids.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  (this->state).scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (other->state).scan_state.column_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->state).scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = puVar7;
  *(pointer *)
   ((long)&(this->state).scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       *(pointer *)
        ((long)&(other->state).scan_state.column_ids.
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(other->state).scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (other->state).scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(other->state).scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  return;
}

Assistant:

BatchCollectionChunkScanState(BatchCollectionChunkScanState &&other) = default;